

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worm.c
# Opt level: O3

void place_wsegs(monst *worm)

{
  ulong uVar1;
  wseg *pwVar2;
  level *plVar3;
  
  uVar1 = (ulong)worm->wormno;
  if (uVar1 != 0) {
    plVar3 = worm->dlevel;
    for (pwVar2 = plVar3->wtails[uVar1]; pwVar2 != plVar3->wheads[uVar1]; pwVar2 = pwVar2->nseg) {
      plVar3->monsters[pwVar2->wx][pwVar2->wy] = worm;
      plVar3 = worm->dlevel;
    }
    return;
  }
  warning("place_wsegs: worm->wormno was 0");
  return;
}

Assistant:

void place_wsegs(struct monst *worm)
{
    struct wseg *curr = worm->dlevel->wtails[worm->wormno];

    if (!worm->wormno) {
	warning("place_wsegs: worm->wormno was 0");
	return;
    }

    while (curr != worm->dlevel->wheads[worm->wormno]) {
	place_worm_seg(worm, curr->wx, curr->wy);
	curr = curr->nseg;
    }
}